

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O2

string * spdlog::details::os::thread_name_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  long *in_FS_OFFSET;
  allocator local_59;
  char buffer [20];
  string local_40 [32];
  
  if ((char)in_FS_OFFSET[-3] == '\0') {
    in_FS_OFFSET[-7] = *in_FS_OFFSET + -0x28;
    in_FS_OFFSET[-6] = 0;
    *(undefined1 *)(in_FS_OFFSET + -5) = 0;
    __cxa_thread_atexit(std::__cxx11::string::~string,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -3) = 1;
  }
  lVar1 = *in_FS_OFFSET;
  if (in_FS_OFFSET[-6] == 0) {
    _thread_name(buffer,0x14);
    std::__cxx11::string::string(local_40,buffer,&local_59);
    std::__cxx11::string::operator=((string *)(lVar1 + -0x38),local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(lVar1 + -0x38));
  return in_RDI;
}

Assistant:

inline std::string thread_name()
{
    static const size_t    RECOMMENDED_BUFFER_SIZE = 20;
    char buffer[RECOMMENDED_BUFFER_SIZE];
    
#if defined(SPDLOG_DISABLE_TID_CACHING) || (defined(_MSC_VER) && (_MSC_VER < 1900)) || defined(__cplusplus_winrt) ||                       \
    (defined(__clang__) && !__has_feature(cxx_thread_local))
    _thread_name(buffer, sizeof(buffer));
    return std::string(buffer);
#else // cache thread name in thread local storage
    static thread_local std::string theThreadName; 
    if (theThreadName.empty())
    {
	_thread_name(buffer, sizeof(buffer));
	theThreadName = std::string(buffer);
    }
    return theThreadName;
#endif
}